

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void free_instruction_operand_pseudos(Proc *proc,Instruction *insn)

{
  Pseudo *pseudo;
  Pseudo *pPVar1;
  PtrListIterator operanditer__;
  PtrListIterator PStack_38;
  
  raviX_ptrlist_reverse_iterator(&PStack_38,(PtrList *)insn->operands);
  pPVar1 = (Pseudo *)0x0;
  while( true ) {
    pseudo = (Pseudo *)raviX_ptrlist_iter_prev(&PStack_38);
    if (pseudo == (Pseudo *)0x0) break;
    free_temp_pseudo(proc,pseudo,false);
    pPVar1 = pseudo;
  }
  if ((pPVar1 != (Pseudo *)0x0) &&
     (((undefined1  [48])*pPVar1 & (undefined1  [48])0xf) == (undefined1  [48])0xc)) {
    free_temp_pseudo(proc,(pPVar1->field_3).range_pseudo,false);
  }
  return;
}

Assistant:

static void free_instruction_operand_pseudos(Proc *proc, Instruction *insn)
{
	Pseudo *operand;
	Pseudo *last = NULL;
	FOR_EACH_PTR_REVERSE(insn->operands, Pseudo, operand) {
		free_temp_pseudo(proc, operand, false);
		last = operand;
	} END_FOR_EACH_PTR_REVERSE(operand)
	if (last != NULL && last->type == PSEUDO_RANGE_SELECT) {
		// free the underlying range pseudo used by range select
		free_temp_pseudo(proc, last->range_pseudo, false);
	}
}